

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void gb_write_ext_ram(Emulator *e,MaskedAddress addr,u8 value)

{
  if ((e->state).memory_map_state.ext_ram_enabled != FALSE) {
    if (0x1fff < addr) {
      __assert_fail("addr <= ADDR_MASK_8K",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                    ,0x4db,"void gb_write_ext_ram(Emulator *, MaskedAddress, u8)");
    }
    (e->state).ext_ram.data[(ulong)addr | (ulong)(e->state).memory_map_state.ext_ram_base] = value;
    (e->state).ext_ram_updated = TRUE;
  }
  return;
}

Assistant:

static void gb_write_ext_ram(Emulator* e, MaskedAddress addr, u8 value) {
  if (MMAP_STATE.ext_ram_enabled) {
    assert(addr <= ADDR_MASK_8K);
    EXT_RAM.data[MMAP_STATE.ext_ram_base | addr] = value;
    e->state.ext_ram_updated = TRUE;
  } else {
    HOOK(write_ram_disabled_ab, addr, value);
  }
}